

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O0

ClipResult __thiscall Text::clip_position(Text *this,Point position)

{
  value_type vVar1;
  value_type vVar2;
  ClipResult CVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  uint32_t local_34;
  uint32_t end;
  uint32_t start;
  uint32_t row;
  Text *this_local;
  uint uStack_18;
  Point position_local;
  uint32_t local_c;
  
  this_local._4_4_ = position.row;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->line_offsets);
  if (((ulong)position & 0xffffffff) < sVar4) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->line_offsets,(ulong)position & 0xffffffff);
    vVar1 = *pvVar5;
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->line_offsets);
    if (((ulong)position & 0xffffffff) == sVar4 - 1) {
      sVar6 = std::__cxx11::
              basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                        (&this->content);
      local_34 = (uint32_t)sVar6;
    }
    else {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->line_offsets,(ulong)(this_local._4_4_ + 1));
      vVar2 = *pvVar5;
      local_34 = vVar2 - 1;
      if ((local_34 != 0) &&
         (pvVar7 = std::__cxx11::
                   basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                   operator[](&this->content,(ulong)(vVar2 - 2)), *pvVar7 == L'\r')) {
        local_34 = vVar2 - 2;
      }
    }
    uStack_18 = position.column;
    if (local_34 - vVar1 < uStack_18) {
      Point::Point(&position_local,this_local._4_4_,local_34 - vVar1);
      local_c = local_34;
    }
    else {
      local_c = vVar1 + uStack_18;
      position_local = position;
    }
  }
  else {
    position_local = extent(this);
    local_c = size(this);
  }
  CVar3.offset = local_c;
  CVar3.position = position_local;
  return CVar3;
}

Assistant:

ClipResult Text::clip_position(Point position) const {
  uint32_t row = position.row;
  if (row >= line_offsets.size()) {
    return {extent(), size()};
  } else {
    uint32_t start = line_offsets[row];
    uint32_t end;
    if (row == line_offsets.size() - 1) {
      end = content.size();
    } else {
      end = line_offsets[row + 1] - 1;
      if (end > 0 && content[end - 1] == '\r') {
        end--;
      }
    }
    if (position.column > end - start) {
      return {Point(row, end - start), end};
    } else {
      return {position, start + position.column};
    }
  }
}